

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

uint8_t expr_to_next_slot(Parser *psr,Node *node)

{
  int iVar1;
  uint8_t dest;
  
  expr_discharge(psr,node);
  expr_free_node(psr,node);
  iVar1 = psr->scope->next_slot;
  dest = (uint8_t)iVar1;
  if (dest != 0xff) {
    psr->scope->next_slot = iVar1 + 1;
    expr_to_slot(psr,dest,node);
    return dest;
  }
  psr_trigger_err(psr,"too many locals in function");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                ,0x290,"uint8_t expr_to_next_slot(Parser *, Node *)");
}

Assistant:

static uint8_t expr_to_next_slot(Parser *psr, Node *node) {
	// Only deal with discharged values
	expr_discharge(psr, node);

	// Free the node on top of the stack, so we can re-use it
	expr_free_node(psr, node);

	// Allocate a new slot on top of the stack for storing the node into
	uint8_t slot = (uint8_t) psr->scope->next_slot;

	// Check we don't overflow the stack with too many locals
	if (slot >= MAX_LOCALS_IN_FN) {
		psr_trigger_err(psr, "too many locals in function");
		UNREACHABLE();
	}

	// Advance the next slot counter and store the local
	psr->scope->next_slot++;
	expr_to_slot(psr, slot, node);
	return slot;
}